

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<capnp::word>::~Array(Array<capnp::word> *this)

{
  word *pwVar1;
  size_t sVar2;
  
  pwVar1 = this->ptr;
  if (pwVar1 != (word *)0x0) {
    sVar2 = this->size_;
    this->ptr = (word *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pwVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }